

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.h
# Opt level: O1

void __thiscall HDD::~HDD(HDD *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_HDD = (_func_int **)&PTR__HDD_001dc268;
  Unlock(this);
  if (this->h != -1) {
    close(this->h);
  }
  Reset(this);
  pcVar1 = (this->strFirmwareRevision)._M_dataplus._M_p;
  paVar2 = &(this->strFirmwareRevision).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->strSerialNumber)._M_dataplus._M_p;
  paVar2 = &(this->strSerialNumber).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->strMakeModel)._M_dataplus._M_p;
  paVar2 = &(this->strMakeModel).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~HDD() { Unlock(); if (h != -1) close(h); Reset(); }